

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

QByteArray * __thiscall QResource::uncompressedData(QResource *this)

{
  QResourcePrivate *pQVar1;
  char *pcVar2;
  longlong lVar3;
  char *bufferSize;
  __off_t __length;
  QResourcePrivate *in_RDI;
  long in_FS_OFFSET;
  qint64 n;
  QResourcePrivate *d;
  QByteArray *result;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  Initialization IVar4;
  QResourcePrivate *this_00;
  QMessageLogger local_28;
  long local_8;
  
  IVar4 = (Initialization)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = d_func((QResource *)0x2e7a22);
  pcVar2 = (char *)uncompressedSize((QResource *)
                                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if ((long)pcVar2 < 0) {
    QByteArray::QByteArray((QByteArray *)0x2e7a48);
  }
  else {
    lVar3 = std::numeric_limits<long_long>::max();
    if (lVar3 < (long)pcVar2) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 in_stack_ffffffffffffff58);
      QMessageLogger::warning
                (&local_28,
                 "QResource: compressed content does not fit into a QByteArray; use QFile instead");
      QByteArray::QByteArray((QByteArray *)0x2e7a9f);
    }
    else if (pQVar1->compressionAlgo == '\0') {
      QByteArray::fromRawData((char *)this_00,(qsizetype)pcVar2);
    }
    else {
      (this_00->fileName).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ((DataPointer *)&this_00->locale)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (this_00->fileName).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)this_00,(qsizetype)pcVar2,IVar4);
      bufferSize = QByteArray::data((QByteArray *)
                                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pcVar2 = (char *)QResourcePrivate::decompress(this_00,pcVar2,(qsizetype)bufferSize);
      if ((long)pcVar2 < 0) {
        QByteArray::clear((QByteArray *)0x2e7b52);
      }
      else {
        QByteArray::truncate((QByteArray *)this_00,pcVar2,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QResource::uncompressedData() const
{
    Q_D(const QResource);
    qint64 n = uncompressedSize();
    if (n < 0)
        return QByteArray();
    if (n > std::numeric_limits<QByteArray::size_type>::max()) {
        qWarning("QResource: compressed content does not fit into a QByteArray; use QFile instead");
        return QByteArray();
    }
    if (d->compressionAlgo == NoCompression)
        return QByteArray::fromRawData(reinterpret_cast<const char *>(d->data), n);

    // decompress
    QByteArray result(n, Qt::Uninitialized);
    n = d->decompress(result.data(), n);
    if (n < 0)
        result.clear();
    else
        result.truncate(n);
    return result;
}